

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void resizeResolveLabel(Parse *p,Vdbe *v,int j)

{
  int *piVar1;
  long lVar2;
  
  lVar2 = 10 - (long)p->nLabel;
  piVar1 = (int *)sqlite3DbReallocOrFree(p->db,p->aLabel,lVar2 * 4);
  p->aLabel = piVar1;
  if (piVar1 == (int *)0x0) {
    p->nLabelAlloc = 0;
  }
  else {
    p->nLabelAlloc = (int)lVar2;
    piVar1[j] = v->nOp;
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void resizeResolveLabel(Parse *p, Vdbe *v, int j){
  int nNewSize = 10 - p->nLabel;
  p->aLabel = sqlite3DbReallocOrFree(p->db, p->aLabel,
                     nNewSize*sizeof(p->aLabel[0]));
  if( p->aLabel==0 ){
    p->nLabelAlloc = 0;
  }else{
#ifdef SQLITE_DEBUG
    int i;
    for(i=p->nLabelAlloc; i<nNewSize; i++) p->aLabel[i] = -1;
#endif
    p->nLabelAlloc = nNewSize;
    p->aLabel[j] = v->nOp;
  }
}